

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::GetTraceStats(ConsumerEndpointImpl *this)

{
  TaskRunner *pTVar1;
  TracingSession *tracing_session;
  anon_class_200_3_69ae5769 local_288;
  function<void_()> local_1c0;
  undefined1 local_1a0 [8];
  WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl> weak_this;
  TracingSession *session;
  TraceStats stats;
  bool success;
  ConsumerEndpointImpl *this_local;
  
  stats._has_field_.super__Base_bitset<1UL>._M_w._7_1_ = 0;
  protos::gen::TraceStats::TraceStats((TraceStats *)&session);
  tracing_session = GetTracingSession(this->service_,this->tracing_session_id_);
  if (tracing_session != (TracingSession *)0x0) {
    stats._has_field_.super__Base_bitset<1UL>._M_w._7_1_ = 1;
    TracingServiceImpl::GetTraceStats
              ((TraceStats *)
               &weak_this.handle_.
                super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,this->service_,tracing_session);
    protos::gen::TraceStats::operator=
              ((TraceStats *)&session,
               (TraceStats *)
               &weak_this.handle_.
                super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    protos::gen::TraceStats::~TraceStats
              ((TraceStats *)
               &weak_this.handle_.
                super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  perfetto::base::WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::GetWeakPtr
            ((WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl> *)local_1a0);
  pTVar1 = this->task_runner_;
  perfetto::base::WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::WeakPtr
            (&local_288.weak_this,
             (WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl> *)local_1a0);
  local_288.success = (bool)(stats._has_field_.super__Base_bitset<1UL>._M_w._7_1_ & 1);
  protos::gen::TraceStats::TraceStats(&local_288.stats,(TraceStats *)&session);
  ::std::function<void()>::
  function<perfetto::TracingServiceImpl::ConsumerEndpointImpl::GetTraceStats()::__0,void>
            ((function<void()> *)&local_1c0,&local_288);
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1,&local_1c0);
  ::std::function<void_()>::~function(&local_1c0);
  GetTraceStats()::$_0::~__0((__0 *)&local_288);
  perfetto::base::WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::~WeakPtr
            ((WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl> *)local_1a0);
  protos::gen::TraceStats::~TraceStats((TraceStats *)&session);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::GetTraceStats() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  bool success = false;
  TraceStats stats;
  TracingSession* session = service_->GetTracingSession(tracing_session_id_);
  if (session) {
    success = true;
    stats = service_->GetTraceStats(session);
  }
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, success, stats] {
    if (weak_this)
      weak_this->consumer_->OnTraceStats(success, stats);
  });
}